

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O2

uint64_t aom_sum_sse_2d_i16_avx2(int16_t *src,int src_stride,int width,int height,int *sum)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  uint64_t uVar10;
  int row;
  long lVar11;
  int iVar12;
  int16_t *piVar13;
  int16_t *piVar14;
  int16_t *piVar15;
  int iVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  
  if ((width == 4) && (height == 4)) {
    uVar10 = aom_sum_sse_2d_i16_4x4_sse2(src,src_stride,sum);
    return uVar10;
  }
  uVar9 = height & 3;
  if ((width == 4) && (uVar9 == 0)) {
    uVar10 = aom_sum_sse_2d_i16_4xn_sse2(src,src_stride,height,sum);
    return uVar10;
  }
  if ((width == 8) && (uVar9 == 0)) {
    uVar10 = aom_sum_sse_2d_i16_nxn_sse2(src,src_stride,8,height,sum);
    return uVar10;
  }
  if (uVar9 != 0 || (width & 0xfU) != 0) {
    uVar10 = aom_sum_sse_2d_i16_c(src,src_stride,width,height,sum);
    return uVar10;
  }
  iVar12 = src_stride << 2;
  piVar13 = src + src_stride * 3;
  piVar14 = src + src_stride * 2;
  piVar15 = src + src_stride;
  auVar17 = ZEXT1664((undefined1  [16])0x0);
  auVar19._8_2_ = 1;
  auVar19._0_8_ = 0x1000100010001;
  auVar19._10_2_ = 1;
  auVar19._12_2_ = 1;
  auVar19._14_2_ = 1;
  auVar19._16_2_ = 1;
  auVar19._18_2_ = 1;
  auVar19._20_2_ = 1;
  auVar19._22_2_ = 1;
  auVar19._24_2_ = 1;
  auVar19._26_2_ = 1;
  auVar19._28_2_ = 1;
  auVar19._30_2_ = 1;
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  for (iVar16 = 0; iVar16 < height; iVar16 = iVar16 + 4) {
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    for (lVar11 = 0; auVar20 = auVar21._0_32_, lVar11 < width; lVar11 = lVar11 + 0x10) {
      auVar1 = *(undefined1 (*) [32])(src + lVar11);
      auVar2 = *(undefined1 (*) [32])(piVar15 + lVar11);
      auVar3 = *(undefined1 (*) [32])(piVar14 + lVar11);
      auVar4 = *(undefined1 (*) [32])(piVar13 + lVar11);
      auVar7 = vpaddw_avx2(auVar2,auVar1);
      auVar8 = vpaddw_avx2(auVar4,auVar3);
      auVar7 = vpaddw_avx2(auVar7,auVar8);
      auVar7 = vpmaddwd_avx2(auVar7,auVar19);
      auVar7 = vpaddd_avx2(auVar7,auVar17._0_32_);
      auVar17 = ZEXT3264(auVar7);
      auVar7 = vpmaddwd_avx2(auVar1,auVar1);
      auVar1 = vpmaddwd_avx2(auVar2,auVar2);
      auVar2 = vpmaddwd_avx2(auVar3,auVar3);
      auVar1 = vpaddd_avx2(auVar1,auVar2);
      auVar2 = vpmaddwd_avx2(auVar4,auVar4);
      auVar20 = vpaddd_avx2(auVar7,auVar20);
      auVar20 = vpaddd_avx2(auVar20,auVar1);
      auVar20 = vpaddd_avx2(auVar20,auVar2);
      auVar21 = ZEXT3264(auVar20);
    }
    auVar1 = vpunpckldq_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar20 = vpunpckhdq_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar20 = vpaddq_avx2(auVar18._0_32_,auVar20);
    auVar20 = vpaddq_avx2(auVar20,auVar1);
    auVar18 = ZEXT3264(auVar20);
    piVar13 = piVar13 + iVar12;
    piVar14 = piVar14 + iVar12;
    piVar15 = piVar15 + iVar12;
    src = src + iVar12;
  }
  auVar5 = vphaddd_avx(auVar17._16_16_,auVar17._0_16_);
  auVar5 = vphaddd_avx(auVar5,auVar5);
  auVar5 = vphaddd_avx(auVar5,auVar5);
  *sum = *sum + auVar5._0_4_;
  auVar5 = vpaddq_avx(auVar18._0_16_,auVar18._16_16_);
  auVar6 = vpshufd_avx(auVar5,0xee);
  auVar5 = vpaddq_avx(auVar6,auVar5);
  return auVar5._0_8_;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_avx2(const int16_t *src, int src_stride, int width,
                                 int height, int *sum) {
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_sse_2d_i16_4x4_sse2(src, src_stride, sum);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_sse_2d_i16_4xn_sse2(src, src_stride, height, sum);
  } else if (LIKELY(width == 8 && (height & 3) == 0)) {
    return aom_sum_sse_2d_i16_nxn_sse2(src, src_stride, width, height, sum);
  } else if (LIKELY(((width & 15) == 0) && ((height & 3) == 0))) {
    return aom_sum_sse_2d_i16_nxn_avx2(src, src_stride, width, height, sum);
  } else {
    return aom_sum_sse_2d_i16_c(src, src_stride, width, height, sum);
  }
}